

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

int __thiscall
duckdb::Interpolator<false>::Operation<int,int,duckdb::MadAccessor<int,int,int>>
          (Interpolator<false> *this,int *v_t,Vector *result,MadAccessor<int,_int,_int> *accessor)

{
  QuantileCompare<duckdb::MadAccessor<int,_int,_int>_> __comp;
  QuantileCompare<duckdb::MadAccessor<int,_int,_int>_> __comp_00;
  QuantileCompare<duckdb::MadAccessor<int,_int,_int>_> __comp_01;
  MadAccessor<int,_int,_int> *in_RCX;
  byte *in_RDI;
  int hi;
  int lo;
  QuantileCompare<duckdb::MadAccessor<int,_int,_int>_> comp;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  Vector *in_stack_ffffffffffffffc0;
  MadAccessor<int,_int,_int> *in_stack_ffffffffffffffc8;
  double in_stack_ffffffffffffffd0;
  int local_4;
  
  QuantileCompare<duckdb::MadAccessor<int,_int,_int>_>::QuantileCompare
            ((QuantileCompare<duckdb::MadAccessor<int,_int,_int>_> *)&stack0xffffffffffffffc0,in_RCX
             ,(bool)(*in_RDI & 1));
  if (*(long *)(in_RDI + 0x18) == *(long *)(in_RDI + 0x10)) {
    __comp.accessor_r = in_stack_ffffffffffffffc8;
    __comp.accessor_l = (MadAccessor<int,_int,_int> *)in_stack_ffffffffffffffc0;
    __comp._16_8_ = in_stack_ffffffffffffffd0;
    std::nth_element<int*,duckdb::QuantileCompare<duckdb::MadAccessor<int,int,int>>>
              ((int *)in_stack_ffffffffffffffc8,(int *)in_stack_ffffffffffffffc0,
               (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),__comp);
    MadAccessor<int,_int,_int>::operator()
              (in_stack_ffffffffffffffc8,(INPUT_TYPE_conflict1 *)in_stack_ffffffffffffffc0);
    local_4 = CastInterpolation::Cast<int,int>
                        ((int *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    __comp_00.accessor_r = in_stack_ffffffffffffffc8;
    __comp_00.accessor_l = (MadAccessor<int,_int,_int> *)in_stack_ffffffffffffffc0;
    __comp_00._16_8_ = in_stack_ffffffffffffffd0;
    std::nth_element<int*,duckdb::QuantileCompare<duckdb::MadAccessor<int,int,int>>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),__comp_00);
    __comp_01.accessor_r = in_stack_ffffffffffffffc8;
    __comp_01.accessor_l = (MadAccessor<int,_int,_int> *)in_stack_ffffffffffffffc0;
    __comp_01._16_8_ = in_stack_ffffffffffffffd0;
    std::nth_element<int*,duckdb::QuantileCompare<duckdb::MadAccessor<int,int,int>>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),__comp_01);
    MadAccessor<int,_int,_int>::operator()
              (in_stack_ffffffffffffffc8,(INPUT_TYPE_conflict1 *)in_stack_ffffffffffffffc0);
    CastInterpolation::Cast<int,int>((int *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    MadAccessor<int,_int,_int>::operator()
              (in_stack_ffffffffffffffc8,(INPUT_TYPE_conflict1 *)in_stack_ffffffffffffffc0);
    CastInterpolation::Cast<int,int>((int *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    local_4 = CastInterpolation::Interpolate<int>
                        ((int *)in_RDI,in_stack_ffffffffffffffd0,(int *)in_stack_ffffffffffffffc8);
  }
  return local_4;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}